

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::UpdateEntryPointsOnDebugReparse(FunctionBody *this)

{
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  ScriptFunctionType *pSVar2;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar3;
  FunctionBody *this_00;
  int i;
  long lVar4;
  FunctionEntryPointInfo *local_58;
  ProxyEntryPointInfo *entryPointInfo;
  JavascriptMethod newEntryPoint;
  ProxyEntryPointInfo **local_40;
  bool *local_38;
  bool local_29 [8];
  bool isAsmJS;
  
  this_00 = this;
  local_58 = GetDefaultFunctionEntryPointInfo(this);
  entryPointInfo =
       (ProxyEntryPointInfo *)
       FunctionProxy::GetDirectEntryPoint((FunctionProxy *)this_00,(ProxyEntryPointInfo *)local_58);
  local_40 = &entryPointInfo;
  local_29[0] = (bool)((byte)((ushort)*(undefined2 *)
                                       &(this->super_ParseableFunctionInfo).super_FunctionProxy.
                                        field_0x45 >> 9) & 1);
  local_38 = local_29;
  newEntryPoint = (JavascriptMethod)&local_58;
  pLVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
                     ((FunctionProxy *)this);
  if (pLVar3 != (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    for (lVar4 = 0;
        lVar4 < (pLVar3->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar4 = lVar4 + 1) {
      pRVar1 = (pLVar3->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar4].ptr;
      if ((((ulong)pRVar1 & 1) == 0 &&
           pRVar1 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
         (pSVar2 = (ScriptFunctionType *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
         pSVar2 != (ScriptFunctionType *)0x0)) {
        UpdateEntryPointsOnDebugReparse::anon_class_24_3_558ab67d::operator()
                  ((anon_class_24_3_558ab67d *)&newEntryPoint,pSVar2);
      }
    }
  }
  pSVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    UpdateEntryPointsOnDebugReparse::anon_class_24_3_558ab67d::operator()
              ((anon_class_24_3_558ab67d *)&newEntryPoint,pSVar2);
  }
  pSVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    UpdateEntryPointsOnDebugReparse::anon_class_24_3_558ab67d::operator()
              ((anon_class_24_3_558ab67d *)&newEntryPoint,pSVar2);
  }
  return;
}

Assistant:

void FunctionBody::UpdateEntryPointsOnDebugReparse()
    {
        // Update all function types associated with this function body. Note that we can't rely on updating
        // types pointed to by function objects, because the type may evolve to one that is not currently referenced.

        ProxyEntryPointInfo * entryPointInfo = this->GetDefaultFunctionEntryPointInfo();
        JavascriptMethod newEntryPoint = this->GetDirectEntryPoint(entryPointInfo);
        bool isAsmJS = this->GetIsAsmjsMode();

        auto updateOneType = [&](ScriptFunctionType* functionType) {
            // Note that the ScriptFunctionType method will handle cross-site thunks correctly.
            functionType->ChangeEntryPoint(entryPointInfo, newEntryPoint, isAsmJS);
        };

        this->MapFunctionObjectTypes(updateOneType);
    }